

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O2

void ut::is_not_null<double*>(double **value,LocationInfo *location)

{
  FailedAssertion *this;
  allocator local_39;
  string local_38;
  
  if (*value != (double *)0x0) {
    return;
  }
  this = (FailedAssertion *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string((string *)&local_38,"Value is null!",&local_39);
  FailedAssertion::FailedAssertion(this,&local_38,location);
  __cxa_throw(this,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
}

Assistant:

inline void is_not_null(const T &value, const LocationInfo &location)
	{
		if (!(value != NULL))
			throw FailedAssertion("Value is null!", location);
	}